

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.h
# Opt level: O0

void __thiscall FListMenuDescriptor::Reset(FListMenuDescriptor *this)

{
  FListMenuDescriptor *this_local;
  
  this->mSelectOfsX = 0;
  this->mSelectOfsY = 0;
  FTextureID::SetInvalid(&this->mSelector);
  this->mDisplayTop = 0;
  this->mXpos = 0;
  this->mYpos = 0;
  this->mLinespacing = 0;
  FString::operator=(&(this->super_FMenuDescriptor).mNetgameMessage,"");
  this->mFont = (FFont *)0x0;
  this->mFontColor = CR_UNTRANSLATED;
  this->mFontColor2 = CR_UNTRANSLATED;
  return;
}

Assistant:

void Reset()
	{
		// Reset the default settings (ignore all other values in the struct)
		mSelectOfsX = 0;
		mSelectOfsY = 0;
		mSelector.SetInvalid();
		mDisplayTop = 0;
		mXpos = 0;
		mYpos = 0;
		mLinespacing = 0;
		mNetgameMessage = "";
		mFont = NULL;
		mFontColor = CR_UNTRANSLATED;
		mFontColor2 = CR_UNTRANSLATED;
	}